

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_compare_siblings_
                 (lyd_node *node1,lyd_node *node2,uint32_t options,ly_bool parental_schemas_checked)

{
  lysc_node *plVar1;
  lyd_node *plVar2;
  LY_ERR ret__;
  LY_ERR LVar3;
  lyd_node *in_RAX;
  LY_ERR ret___1;
  bool bVar4;
  bool bVar5;
  lyd_node *iter2;
  lyd_node *local_38;
  
  bVar4 = node1 != (lyd_node *)0x0;
  bVar5 = node2 != (lyd_node *)0x0;
  if (bVar4 && bVar5) {
    local_38 = in_RAX;
    do {
      LVar3 = lyd_compare_single_schema(node1,node2,options,parental_schemas_checked);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      plVar1 = node1->schema;
      plVar2 = node2;
      if (plVar1 != (lysc_node *)0x0) {
        if (plVar1->nodetype == 8) {
          plVar2 = node2;
          if ((plVar1->flags & 1) != 0) {
LAB_00122383:
            plVar2 = node2;
            if ((plVar1->flags & 0x80) != 0) {
              LVar3 = lyd_find_sibling_first(node2,node1,&local_38);
              if (LVar3 == LY_ENOTFOUND) {
                LVar3 = LY_ENOT;
              }
              plVar2 = local_38;
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
            }
          }
        }
        else {
          plVar2 = node2;
          if ((plVar1->nodetype == 0x10) && (plVar2 = node2, (plVar1->flags & 0x200) == 0))
          goto LAB_00122383;
        }
      }
      local_38 = plVar2;
      LVar3 = lyd_compare_single_data(node1,local_38,options | 1);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      node1 = node1->next;
      node2 = node2->next;
      bVar5 = node2 != (lyd_node *)0x0;
      bVar4 = node1 != (lyd_node *)0x0;
    } while ((bVar4) && (node2 != (lyd_node *)0x0));
  }
  LVar3 = LY_ENOT;
  if (!bVar4 && !bVar5) {
    LVar3 = LY_SUCCESS;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyd_compare_siblings_(const struct lyd_node *node1, const struct lyd_node *node2, uint32_t options,
        ly_bool parental_schemas_checked)
{
    LY_ERR r;
    const struct lyd_node *iter2;

    while (node1 && node2) {
        /* schema match */
        r = lyd_compare_single_schema(node1, node2, options, parental_schemas_checked);
        LY_CHECK_RET(r);

        if (node1->schema && (((node1->schema->nodetype == LYS_LIST) && !(node1->schema->flags & LYS_KEYLESS)) ||
                ((node1->schema->nodetype == LYS_LEAFLIST) && (node1->schema->flags & LYS_CONFIG_W))) &&
                (node1->schema->flags & LYS_ORDBY_SYSTEM)) {
            /* find a matching instance in case they are ordered differently */
            r = lyd_find_sibling_first(node2, node1, (struct lyd_node **)&iter2);
            if (r == LY_ENOTFOUND) {
                /* no matching instance, data not equal */
                r = LY_ENOT;
            }
            LY_CHECK_RET(r);
        } else {
            /* compare with the current node */
            iter2 = node2;
        }

        /* data match */
        r = lyd_compare_single_data(node1, iter2, options | LYD_COMPARE_FULL_RECURSION);
        LY_CHECK_RET(r);

        node1 = node1->next;
        node2 = node2->next;
    }

    return (node1 || node2) ? LY_ENOT : LY_SUCCESS;
}